

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O2

boolean obstructed(int x,int y)

{
  monst *worm;
  boolean bVar1;
  uint uVar2;
  int iVar3;
  obj *poVar4;
  char *pcVar5;
  
  worm = level->monsters[x][y];
  if (((worm == (monst *)0x0) || (uVar2 = *(uint *)&worm->field_0x60, (uVar2 >> 9 & 1) != 0)) ||
     (worm->m_ap_type == '\x01')) {
    if (level->objects[x][y] == (obj *)0x0) {
      return '\0';
    }
LAB_001af327:
    pline("Something\'s in the way.");
    return '\x01';
  }
  if (worm->m_ap_type == '\x02') goto LAB_001af327;
  if (worm->wormno == '\0') {
    if ((viz_array[worm->my][worm->mx] & 2U) == 0) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001af390;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001af387;
      }
      else {
LAB_001af387:
        if (ublindf == (obj *)0x0) goto LAB_001af43a;
LAB_001af390:
        if (ublindf->oartifact != '\x1d') goto LAB_001af43a;
      }
      if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
          (((youmonst.data)->mflags3 & 0x100) == 0)) ||
         (((viz_array[worm->my][worm->mx] & 1U) == 0 || ((worm->data->mflags3 & 0x200) == 0))))
      goto LAB_001af43a;
    }
LAB_001af3ed:
    if ((((uVar2 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)) {
      if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
      goto LAB_001af42d;
      goto LAB_001af43a;
    }
    if ((uVar2 & 0x280) != 0) goto LAB_001af43a;
LAB_001af42d:
    if ((u._1052_1_ & 0x20) != 0) goto LAB_001af43a;
LAB_001af58c:
    pcVar5 = Monnam(worm);
  }
  else {
    bVar1 = worm_known(level,worm);
    if (bVar1 != '\0') {
      uVar2 = *(uint *)&worm->field_0x60;
      goto LAB_001af3ed;
    }
LAB_001af43a:
    if (((worm->data->mflags1 & 0x10000) == 0) &&
       ((poVar4 = which_armor(worm,4), poVar4 == (obj *)0x0 ||
        (poVar4 = which_armor(worm,4), poVar4->otyp != 0x4f)))) {
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001af48e;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001af489;
      }
      else {
LAB_001af489:
        if (ublindf != (obj *)0x0) {
LAB_001af48e:
          if (ublindf->oartifact == '\x1d') goto LAB_001af521;
        }
        if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
             (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
             youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001af58c;
      }
LAB_001af521:
      if ((u.uprops[0x19].extrinsic != 0) &&
         ((u.uprops[0x19].blocked == 0 &&
          (iVar3 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar3 < 0x41))))
      goto LAB_001af58c;
    }
    if ((u.uprops[0x42].intrinsic != 0) ||
       ((u.uprops[0x42].extrinsic != 0 || (bVar1 = match_warn_of_mon(worm), bVar1 != '\0'))))
    goto LAB_001af58c;
    pcVar5 = "Some creature";
  }
  pline("%s stands in the way!",pcVar5);
  if (worm->wormno == '\0') {
    if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_001af660;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001af605;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001af5fc;
    }
    else {
LAB_001af5fc:
      if (ublindf == (obj *)0x0) goto LAB_001af6b6;
LAB_001af605:
      if (ublindf->oartifact != '\x1d') goto LAB_001af6b6;
    }
    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
         (((youmonst.data)->mflags3 & 0x100) != 0)) && ((viz_array[worm->my][worm->mx] & 1U) != 0))
       && ((worm->data->mflags3 & 0x200) != 0)) goto LAB_001af660;
  }
  else {
    bVar1 = worm_known(level,worm);
    if (bVar1 != '\0') {
LAB_001af660:
      uVar2 = *(uint *)&worm->field_0x60;
      if ((((uVar2 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar2 & 0x280) == 0) goto LAB_001af6a6;
      }
      else if (((uVar2 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001af6a6:
        if ((u._1052_1_ & 0x20) == 0) {
          return '\x01';
        }
      }
    }
  }
LAB_001af6b6:
  if (((worm->data->mflags1 & 0x10000) != 0) ||
     ((poVar4 = which_armor(worm,4), poVar4 != (obj *)0x0 &&
      (poVar4 = which_armor(worm,4), poVar4->otyp == 0x4f)))) goto joined_r0x001af7fa;
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001af70a;
    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001af705;
  }
  else {
LAB_001af705:
    if (ublindf != (obj *)0x0) {
LAB_001af70a:
      if (ublindf->oartifact == '\x1d') goto LAB_001af7a4;
    }
    if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
         (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
         youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) {
      return '\x01';
    }
  }
LAB_001af7a4:
  if (((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) &&
     (iVar3 = dist2((int)worm->mx,(int)worm->my,(int)u.ux,(int)u.uy), iVar3 < 0x41)) {
    return '\x01';
  }
joined_r0x001af7fa:
  if (u.uprops[0x42].intrinsic != 0) {
    return '\x01';
  }
  if (u.uprops[0x42].extrinsic != 0) {
    return '\x01';
  }
  bVar1 = match_warn_of_mon(worm);
  if (bVar1 != '\0') {
    return '\x01';
  }
  map_invisible(worm->mx,worm->my);
  return '\x01';
}

Assistant:

static boolean obstructed(int x, int y)
{
	struct monst *mtmp = m_at(level, x, y);

	if (mtmp && mtmp->m_ap_type != M_AP_FURNITURE) {
		if (mtmp->m_ap_type == M_AP_OBJECT) goto objhere;
		pline("%s stands in the way!", !canspotmon(level, mtmp) ?
			"Some creature" : Monnam(mtmp));
		if (!canspotmon(level, mtmp))
		    map_invisible(mtmp->mx, mtmp->my);
		return TRUE;
	}
	if (OBJ_AT(x, y)) {
objhere:	pline("Something's in the way.");
		return TRUE;
	}
	return FALSE;
}